

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O0

void findOutSeparators(IntVector *target,IntVector *source,uint n)

{
  size_type sVar1;
  reference piVar2;
  reference pvVar3;
  iterator this;
  uint uVar4;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  ulong uVar5;
  vector<int,_std::allocator<int>_> *in_RDI;
  bool bVar6;
  uint tmpN1;
  uint i;
  uint k;
  uint h;
  uint n1;
  uint size1;
  iterator it;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar7;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  int *local_20;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  vector<int,_std::allocator<int>_> *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_10);
  local_24 = (int)sVar1 - 1;
  local_28 = local_14 - 1;
  local_2c = local_24 / local_28;
  local_30 = local_24 % local_28;
  local_34 = 0;
  local_38 = 0;
  while (uVar4 = local_30 - 1, bVar6 = local_30 != 0, local_30 = uVar4, bVar6) {
    local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    in_stack_ffffffffffffff84 = *piVar2;
    uVar5 = (ulong)local_34;
    local_34 = local_34 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_8,uVar5);
    *pvVar3 = in_stack_ffffffffffffff84;
    local_38 = local_2c;
    while (uVar4 = local_38 - 1, bVar6 = local_38 != 0, local_38 = uVar4, bVar6) {
      local_48 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator++(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    }
  }
  while( true ) {
    local_58 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_50 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator-(in_stack_ffffffffffffff88,
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar6) break;
    local_60 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    in_stack_ffffffffffffff80 = *piVar2;
    uVar5 = (ulong)local_34;
    local_34 = local_34 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_8,uVar5);
    *pvVar3 = in_stack_ffffffffffffff80;
    local_38 = local_2c - 1;
    while (uVar4 = local_38 - 1, bVar6 = local_38 != 0, local_38 = uVar4, bVar6) {
      local_68 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator++(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    }
  }
  this = std::vector<int,_std::allocator<int>_>::end
                   ((vector<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       (this._M_current,
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_70);
  iVar7 = *piVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_8,(ulong)local_34);
  *pvVar3 = iVar7;
  return;
}

Assistant:

void findOutSeparators (IntVector &target, IntVector &source, uint n) {
	auto it		= source.begin ();
	uint size1	= source.size ()-1;		// Number of elements to be taken into account (belonging to vector)
	uint n1		= n-1;					// Number of elements to be selected
	uint h		= size1/n1;				// Size of subset
    uint k		= size1%n1;				// Number of subset with size h+1
	uint i		= 0;					// Index of target array
	uint tmpN1	= 0;
	
	while (k--) {
		target[i++]	= *(it++);
		tmpN1		= h;
		while (tmpN1--)
			it++;
    }
    while (it != source.end()-1) {
		target[i++]	= *(it++);
		tmpN1	= h-1;
		while (tmpN1--)
			it++;
	}

	target[i]	= *(source.end()-1);
}